

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  byte bVar2;
  xmlChar xVar3;
  xmlParserInputPtr pxVar4;
  byte *pbVar5;
  startElementSAXFunc p_Var6;
  uint uVar7;
  int iVar8;
  xmlChar *pxVar9;
  xmlChar **ppxVar10;
  uint uVar11;
  xmlChar *pxVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  xmlChar **ppxVar16;
  xmlChar *attvalue;
  xmlChar *local_40;
  xmlChar *local_38;
  
  pxVar4 = ctxt->input;
  pxVar9 = pxVar4->cur;
  if (*pxVar9 == '<') {
    ppxVar16 = ctxt->atts;
    uVar14 = ctxt->maxatts;
    pxVar4->col = pxVar4->col + 1;
    pxVar4->cur = pxVar9 + 1;
    if (pxVar9[1] == '\0') {
      xmlParserGrow(ctxt);
    }
    local_38 = xmlParseName(ctxt);
    if (local_38 == (xmlChar *)0x0) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "xmlParseStartTag: invalid element name\n");
      local_38 = (xmlChar *)0x0;
    }
    else {
      xmlSkipBlankChars(ctxt);
      pxVar4 = ctxt->input;
      if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      iVar15 = 0;
      while( true ) {
        pbVar5 = ctxt->input->cur;
        bVar1 = *pbVar5;
        bVar2 = bVar1;
        if (bVar1 == 0x2f) {
          bVar2 = pbVar5[1];
        }
        if (((bVar2 == 0x3e) ||
            (((1 < (byte)(bVar1 - 9) && (bVar1 != 0xd && bVar1 < 0x20)) || (1 < ctxt->disableSAX))))
           || (pxVar9 = xmlParseAttribute(ctxt,&local_40), pxVar9 == (xmlChar *)0x0)) break;
        if (local_40 != (xmlChar *)0x0) {
          if (0 < iVar15) {
            lVar13 = 0;
            do {
              iVar8 = xmlStrEqual(ppxVar16[lVar13],pxVar9);
              if (iVar8 != 0) {
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ATTRIBUTE_REDEFINED,
                           XML_ERR_FATAL,pxVar9,(xmlChar *)0x0,(xmlChar *)0x0,0,
                           "Attribute %s redefined\n",pxVar9);
                goto LAB_00139618;
              }
              lVar13 = lVar13 + 2;
            } while ((int)lVar13 < iVar15);
          }
          if ((int)uVar14 < iVar15 + 4) {
            if ((int)uVar14 < 1) {
              pxVar12 = (xmlChar *)0xb;
            }
            else {
              pxVar12 = (xmlChar *)0xffffffff;
              if ((int)uVar14 < 100000000) {
                uVar11 = uVar14 + 1 >> 1;
                uVar7 = uVar11 + uVar14;
                if ((int)(100000000 - uVar11) < (int)uVar14) {
                  uVar7 = 100000000;
                }
                pxVar12 = (xmlChar *)(ulong)uVar7;
              }
            }
            if (((int)pxVar12 < 0) ||
               (ppxVar10 = (xmlChar **)(*xmlRealloc)(ppxVar16,(long)pxVar12 << 4),
               ppxVar10 == (xmlChar **)0x0)) {
              xmlCtxtErrMemory(ctxt);
              iVar8 = 7;
            }
            else {
              uVar14 = (int)pxVar12 * 2;
              pxVar12 = (xmlChar *)(ulong)uVar14;
              ctxt->atts = ppxVar10;
              ctxt->maxatts = uVar14;
              iVar8 = 0;
              ppxVar16 = ppxVar10;
            }
            if (iVar8 == 7) goto LAB_00139618;
            if (iVar8 != 0) {
              return pxVar12;
            }
          }
          ppxVar16[iVar15] = pxVar9;
          ppxVar16[(long)iVar15 + 1] = local_40;
          ppxVar16[(long)iVar15 + 2] = (xmlChar *)0x0;
          (ppxVar16 + (long)iVar15 + 2)[1] = (xmlChar *)0x0;
          local_40 = (xmlChar *)0x0;
          iVar15 = iVar15 + 2;
        }
LAB_00139618:
        if (local_40 != (xmlChar *)0x0) {
          (*xmlFree)(local_40);
        }
        pxVar4 = ctxt->input;
        if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
        pxVar9 = ctxt->input->cur;
        xVar3 = *pxVar9;
        if (xVar3 == '/') {
          xVar3 = pxVar9[1];
        }
        if (xVar3 == '>') break;
        iVar8 = xmlSkipBlankChars(ctxt);
        if (iVar8 == 0) {
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                     "attributes construct error\n");
        }
        if ((ctxt->input->flags & 0x40) == 0) {
          xmlParserShrink(ctxt);
        }
        pxVar4 = ctxt->input;
        if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
      }
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
          (p_Var6 = ctxt->sax->startElement, p_Var6 != (startElementSAXFunc)0x0)) &&
         (ctxt->disableSAX == 0)) {
        ppxVar10 = (xmlChar **)0x0;
        if (0 < iVar15) {
          ppxVar10 = ppxVar16;
        }
        (*p_Var6)(ctxt->userData,local_38,ppxVar10);
      }
      if (1 < iVar15 && ppxVar16 != (xmlChar **)0x0) {
        lVar13 = 1;
        do {
          if (ppxVar16[lVar13] != (xmlChar *)0x0) {
            (*xmlFree)(ppxVar16[lVar13]);
          }
          lVar13 = lVar13 + 2;
        } while ((int)lVar13 < iVar15);
      }
    }
  }
  else {
    local_38 = (xmlChar *)0x0;
  }
  return local_38;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (PARSER_STOPPED(ctxt) == 0)) {
	attname = xmlParseAttribute(ctxt, &attvalue);
        if (attname == NULL)
	    break;
        if (attvalue != NULL) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (nbatts + 4 > maxatts) {
	        const xmlChar **n;
                int newSize;

                newSize = xmlGrowCapacity(maxatts, sizeof(n[0]) * 2,
                                          11, XML_MAX_ATTRS);
                if (newSize < 0) {
		    xmlErrMemory(ctxt);
		    goto failed;
		}
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
                if (newSize < 2)
                    newSize = 2;
#endif
	        n = xmlRealloc(atts, newSize * sizeof(n[0]) * 2);
		if (n == NULL) {
		    xmlErrMemory(ctxt);
		    goto failed;
		}
		atts = n;
                maxatts = newSize * 2;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }

	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;

            attvalue = NULL;
	}

failed:

        if (attvalue != NULL)
            xmlFree(attvalue);

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}